

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubcommandTest.cpp
# Opt level: O0

void __thiscall
TApp_RequiredAndSubcomFallthrough_Test::~TApp_RequiredAndSubcomFallthrough_Test
          (TApp_RequiredAndSubcomFallthrough_Test *this)

{
  TApp_RequiredAndSubcomFallthrough_Test *this_local;
  
  ~TApp_RequiredAndSubcomFallthrough_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(TApp, RequiredAndSubcomFallthrough) {

    std::string baz;
    app.add_option("baz", baz)->required();
    app.add_subcommand("foo");
    auto bar = app.add_subcommand("bar");
    app.fallthrough();

    args = {"other", "bar"};
    run();
    EXPECT_TRUE(bar);
    EXPECT_EQ(baz, "other");

    app.reset();
    args = {"bar", "other2"};
    EXPECT_THROW(run(), CLI::ExtrasError);
}